

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==(NeuralNetworkPreprocessing *a,NeuralNetworkPreprocessing *b)

{
  code *pcVar1;
  bool bVar2;
  PreprocessorCase PVar3;
  PreprocessorCase PVar4;
  string *__lhs;
  string *__rhs;
  NeuralNetworkImageScaler *a_00;
  NeuralNetworkImageScaler *b_00;
  NeuralNetworkMeanImage *a_01;
  NeuralNetworkMeanImage *b_01;
  NeuralNetworkPreprocessing *b_local;
  NeuralNetworkPreprocessing *a_local;
  
  __lhs = NeuralNetworkPreprocessing::featurename_abi_cxx11_(a);
  __rhs = NeuralNetworkPreprocessing::featurename_abi_cxx11_(b);
  bVar2 = std::operator!=(__lhs,__rhs);
  if (bVar2) {
    a_local._7_1_ = false;
  }
  else {
    PVar3 = NeuralNetworkPreprocessing::preprocessor_case(a);
    PVar4 = NeuralNetworkPreprocessing::preprocessor_case(b);
    if (PVar3 == PVar4) {
      PVar3 = NeuralNetworkPreprocessing::preprocessor_case(a);
      if (PVar3 == PREPROCESSOR_NOT_SET) {
        a_local._7_1_ = false;
      }
      else if (PVar3 == kScaler) {
        a_00 = NeuralNetworkPreprocessing::scaler(a);
        b_00 = NeuralNetworkPreprocessing::scaler(b);
        a_local._7_1_ = operator==(a_00,b_00);
      }
      else {
        if (PVar3 != kMeanImage) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        a_01 = NeuralNetworkPreprocessing::meanimage(a);
        b_01 = NeuralNetworkPreprocessing::meanimage(b);
        a_local._7_1_ = operator==(a_01,b_01);
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool operator==(const NeuralNetworkPreprocessing& a,
                        const NeuralNetworkPreprocessing& b) {
            if (a.featurename() != b.featurename()) {
                return false;
            }
            if (a.preprocessor_case() != b.preprocessor_case()) {
                return false;
            }
            switch (a.preprocessor_case()) {
                case NeuralNetworkPreprocessing::kScaler:
                    return a.scaler() == b.scaler();
                case NeuralNetworkPreprocessing::kMeanImage:
                    return a.meanimage() == b.meanimage();
                case NeuralNetworkPreprocessing::PREPROCESSOR_NOT_SET:
                    return false;
            }
        }